

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * str_trim(char *ptr)

{
  ushort **ppuVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *__s;
  bool bVar5;
  
  if (ptr == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    __s = ptr + -1;
    do {
      pcVar4 = __s;
      __s = pcVar4 + 1;
    } while ((*(byte *)((long)*ppuVar1 + (long)pcVar4[1] * 2 + 1) & 0x20) != 0);
    sVar2 = strlen(__s);
    if (1 < sVar2) {
      lVar3 = sVar2 - 2;
      do {
        if ((*(byte *)((long)*ppuVar1 + (long)pcVar4[lVar3 + 2] * 2 + 1) & 0x20) == 0) {
          return __s;
        }
        pcVar4[lVar3 + 2] = '\0';
        bVar5 = lVar3 != 0;
        lVar3 = lVar3 + -1;
      } while (bVar5);
    }
  }
  return __s;
}

Assistant:

char *
str_trim(char *ptr) {
  size_t len;

  if (!ptr) {
    return NULL;
  }

  /* skip leading whitespaces */
  while (isspace(*ptr)) {
    ptr++;
  }

  /* get end of string */
  len = strlen(ptr);
  if (len) {
    /* remove trailing whitespaces */
    while (--len > 0 && isspace(ptr[len])) {
      ptr[len] = 0;
    }
  }
  return ptr;
}